

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall Tokenizer::tryToGetKeywordOrIdentifier(Tokenizer *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Mark *pMVar4;
  const_iterator mark_00;
  Token *this_00;
  Stream *in_RDI;
  mapped_type type;
  string str;
  Mark mark;
  stringstream ss;
  Token *in_stack_fffffffffffffd18;
  Token *in_stack_fffffffffffffd20;
  Token *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  char in_stack_fffffffffffffd3c;
  char in_stack_fffffffffffffd3d;
  undefined1 uVar5;
  Token *this_01;
  string local_2a0 [36];
  undefined4 local_27c;
  string local_240 [92];
  TokenType local_1e4;
  _Self local_1e0;
  _Self local_1d8;
  string local_1d0 [32];
  undefined4 local_1b0;
  Mark local_1a0;
  stringstream local_198 [16];
  Token local_188 [6];
  byte local_1;
  
  std::__cxx11::stringstream::stringstream(local_198);
  pMVar4 = Stream::getMark(in_RDI);
  local_1a0 = *pMVar4;
  cVar1 = Stream::peek((Stream *)0x163ea4);
  iVar3 = isalpha((int)cVar1);
  if (iVar3 == 0) {
    cVar1 = Stream::peek((Stream *)0x163ec5);
    if (cVar1 != '_') {
      local_1 = 0;
      local_1b0 = 1;
      goto LAB_0016420a;
    }
  }
  this_01 = local_188;
  cVar1 = Stream::peek((Stream *)0x163ef2);
  std::operator<<((ostream *)this_01,cVar1);
  Stream::advance((Stream *)in_stack_fffffffffffffd20);
  while( true ) {
    cVar1 = Stream::peek((Stream *)0x163f23);
    iVar3 = isalpha((int)cVar1);
    uVar5 = true;
    if (iVar3 == 0) {
      in_stack_fffffffffffffd3d = Stream::peek((Stream *)0x163f4c);
      iVar3 = isdigit((int)in_stack_fffffffffffffd3d);
      uVar5 = true;
      if (iVar3 == 0) {
        in_stack_fffffffffffffd3c = Stream::peek((Stream *)0x163f75);
        uVar5 = in_stack_fffffffffffffd3c == '_';
      }
    }
    if ((bool)uVar5 == false) break;
    in_stack_fffffffffffffd30 = local_188;
    cVar1 = Stream::peek((Stream *)0x163fad);
    in_stack_fffffffffffffd38 = CONCAT13(cVar1,(int3)in_stack_fffffffffffffd38);
    std::operator<<((ostream *)in_stack_fffffffffffffd30,cVar1);
    Stream::advance((Stream *)in_stack_fffffffffffffd20);
  }
  std::__cxx11::stringstream::str();
  mark_00 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffd18,(key_type *)0x164035);
  local_1d8._M_node = mark_00._M_node;
  local_1e0._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffd18);
  bVar2 = std::operator!=(&local_1d8,&local_1e0);
  if (bVar2) {
    this_00 = (Token *)std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
                       ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
                             *)in_stack_fffffffffffffd20,(key_type *)in_stack_fffffffffffffd18);
    local_1e4 = this_00->type;
    std::__cxx11::string::string(local_240,local_1d0);
    Token::Token(this_01,(TokenType *)
                         CONCAT17(cVar1,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffd3d,
                                                                CONCAT14(in_stack_fffffffffffffd3c,
                                                                         in_stack_fffffffffffffd38))
                                                )),(string *)in_stack_fffffffffffffd30,
                 (Mark *)mark_00._M_node);
    Token::operator=(this_00,in_stack_fffffffffffffd18);
    Token::~Token((Token *)0x164105);
    std::__cxx11::string::~string(local_240);
  }
  else {
    local_27c = 0;
    std::__cxx11::string::string(local_2a0,local_1d0);
    Token::Token(this_01,(TokenType *)
                         CONCAT17(cVar1,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffd3d,
                                                                CONCAT14(in_stack_fffffffffffffd3c,
                                                                         in_stack_fffffffffffffd38))
                                                )),(string *)in_stack_fffffffffffffd30,
                 (Mark *)mark_00._M_node);
    Token::operator=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    Token::~Token((Token *)0x1641ad);
    std::__cxx11::string::~string(local_2a0);
  }
  local_1 = 1;
  local_1b0 = 1;
  std::__cxx11::string::~string(local_1d0);
LAB_0016420a:
  std::__cxx11::stringstream::~stringstream(local_198);
  return (bool)(local_1 & 1);
}

Assistant:

bool Tokenizer::tryToGetKeywordOrIdentifier()
{
  std::stringstream ss;
  const Mark mark = stream_.getMark();
  if(isalpha(stream_.peek()) || stream_.peek() == '_')
  {
    ss << (char)stream_.peek();
    stream_.advance();
    while(isalpha(stream_.peek()) || isdigit(stream_.peek()) || stream_.peek() == '_')
    {
      ss << (char)stream_.peek();
      stream_.advance();
    }
  }
  else
    return false;

  const std::string str = ss.str();
  if(keywords_.find(str) != keywords_.end())
  {
    const auto type = keywordTokenTypes_.at(str);
    token_ = Token{type, str, mark};
  }
  else
    token_ = Token{TokenType::Identifier, str, mark};

  return true;
}